

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderPointsVerification::initTest(TessellationShaderPointsVerification *this)

{
  pointer *pp_Var1;
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_spacing _Var2;
  iterator __position;
  undefined8 uVar3;
  float afVar4 [2];
  uint uVar5;
  int iVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  TessellationShaderUtils *this_00;
  NotSupportedError *this_01;
  _tessellation_levels *levels;
  float afVar9 [2];
  long lVar10;
  _run run;
  GLint gl_max_tess_gen_level_value;
  undefined1 local_88 [12];
  float fStack_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  pointer local_60;
  long local_58;
  uint local_50;
  GLint local_4c;
  Functions *local_48;
  long local_40;
  vector<glcts::TessellationShaderPointsVerification::_run,std::allocator<glcts::TessellationShaderPointsVerification::_run>>
  *local_38;
  Functions *pFVar8;
  
  iVar6 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar8 = (Functions *)CONCAT44(extraout_var,iVar6);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Tessellation shader functionality not supported, skipping","");
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_88);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar8->genVertexArrays)(1,&this->m_vao_id);
  GVar7 = (*pFVar8->getError)();
  glu::checkError(GVar7,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x29c);
  (*pFVar8->bindVertexArray)(this->m_vao_id);
  GVar7 = (*pFVar8->getError)();
  glu::checkError(GVar7,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x29f);
  local_4c = 0;
  (*pFVar8->getIntegerv)((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,&local_4c);
  local_48 = pFVar8;
  GVar7 = (*pFVar8->getError)();
  glu::checkError(GVar7,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
                  ,0x2a5);
  local_38 = (vector<glcts::TessellationShaderPointsVerification::_run,std::allocator<glcts::TessellationShaderPointsVerification::_run>>
              *)&this->m_runs;
  lVar10 = 0;
  do {
    primitive_mode = (&DAT_01ba0778)[lVar10];
    TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
              ((_tessellation_levels_set *)local_88,primitive_mode,local_4c,
               TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);
    afVar4 = stack0xffffffffffffff80;
    uVar3 = local_88._0_8_;
    local_60 = (pointer)local_78._M_allocated_capacity;
    local_50 = (uint)lVar10 & 1;
    local_58 = 0;
    local_40 = lVar10;
    do {
      uVar5 = local_50;
      if ((float  [2])uVar3 != afVar4) {
        _Var2 = (&DAT_01ba0778)[local_58];
        iVar6 = (int)local_58;
        afVar9 = (float  [2])uVar3;
        do {
          if (uVar5 == 0 && iVar6 == 0) {
            if (1.0 < *(float *)afVar9) {
              if (1.0 < *(float *)((long)afVar9 + 4)) goto LAB_00d3a519;
            }
          }
          else {
LAB_00d3a519:
            local_88._0_8_ = *(undefined8 *)afVar9;
            unique0x1000028e = *(float (*) [2])((long)afVar9 + 8);
            local_78._M_allocated_capacity = *(undefined8 *)((long)afVar9 + 0x10);
            local_78._12_4_ = _Var2;
            local_78._8_4_ = primitive_mode;
            __position._M_current =
                 (this->m_runs).
                 super__Vector_base<glcts::TessellationShaderPointsVerification::_run,_std::allocator<glcts::TessellationShaderPointsVerification::_run>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->m_runs).
                super__Vector_base<glcts::TessellationShaderPointsVerification::_run,_std::allocator<glcts::TessellationShaderPointsVerification::_run>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<glcts::TessellationShaderPointsVerification::_run,std::allocator<glcts::TessellationShaderPointsVerification::_run>>
              ::_M_realloc_insert<glcts::TessellationShaderPointsVerification::_run_const&>
                        (local_38,__position,(_run *)local_88);
            }
            else {
              *(undefined8 *)((__position._M_current)->outer + 2) = local_78._M_allocated_capacity;
              (__position._M_current)->primitive_mode = primitive_mode;
              (__position._M_current)->vertex_spacing = _Var2;
              (__position._M_current)->inner[0] = (float)local_88._0_4_;
              (__position._M_current)->inner[1] = (float)local_88._4_4_;
              (__position._M_current)->outer[0] = (float)local_88._8_4_;
              (__position._M_current)->outer[1] = fStack_7c;
              pp_Var1 = &(this->m_runs).
                         super__Vector_base<glcts::TessellationShaderPointsVerification::_run,_std::allocator<glcts::TessellationShaderPointsVerification::_run>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pp_Var1 = *pp_Var1 + 1;
            }
          }
          afVar9 = (float  [2])((long)afVar9 + 0x18);
        } while (afVar9 != afVar4);
      }
      local_58 = local_58 + 1;
    } while (local_58 != 3);
    if ((float  [2])uVar3 != (float  [2])0x0) {
      operator_delete((void *)uVar3,(long)local_60 - uVar3);
    }
    lVar10 = local_40 + 1;
    if (lVar10 == 3) {
      this_00 = (TessellationShaderUtils *)operator_new(0x20);
      TessellationShaderUtils::TessellationShaderUtils(this_00,local_48,&this->super_TestCaseBase);
      this->m_utils = this_00;
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderPointsVerification::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize and bind vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test iterations */
	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	const _tessellation_shader_vertex_spacing vertex_spacings[] = {
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
	};
	const unsigned int n_vertex_spacings = sizeof(vertex_spacings) / sizeof(vertex_spacings[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_levels_set	 levels_set;
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			primitive_mode, gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);

		for (unsigned int n_vertex_spacing = 0; n_vertex_spacing < n_vertex_spacings; ++n_vertex_spacing)
		{
			_tessellation_shader_vertex_spacing vertex_spacing = vertex_spacings[n_vertex_spacing];

			for (_tessellation_levels_set_const_iterator levels_set_iterator = levels_set.begin();
				 levels_set_iterator != levels_set.end(); levels_set_iterator++)
			{
				const _tessellation_levels& levels = *levels_set_iterator;

				/* Skip border cases that this test cannot handle */
				if ((primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS ||
					 primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) &&
					vertex_spacing == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD &&
					(levels.inner[0] <= 1 || levels.inner[1] <= 1))
				{
					continue;
				}

				/* Initialize a test run descriptor for the iteration-specific properties */
				_run run;

				memcpy(run.inner, levels.inner, sizeof(run.inner));
				memcpy(run.outer, levels.outer, sizeof(run.outer));

				run.primitive_mode = primitive_mode;
				run.vertex_spacing = vertex_spacing;

				m_runs.push_back(run);
			} /* for (all level sets) */
		}	 /* for (all vertex spacing modes) */
	}		  /* for (all primitive modes) */

	/* Initialize utils instance.
	 */
	m_utils = new TessellationShaderUtils(gl, this);
}